

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionShape.cpp
# Opt level: O0

char * __thiscall
btCollisionShape::serialize(btCollisionShape *this,void *dataBuffer,btSerializer *serializer)

{
  undefined8 uVar1;
  long lVar2;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  char *name;
  btCollisionShapeData *shapeData;
  
  uVar1 = (**(code **)(*in_RDX + 0x50))();
  lVar2 = (**(code **)(*in_RDX + 0x38))(in_RDX,uVar1);
  *in_RSI = lVar2;
  if (*in_RSI != 0) {
    (**(code **)(*in_RDX + 0x60))(in_RDX,uVar1);
  }
  *(undefined4 *)(in_RSI + 1) = *(undefined4 *)(in_RDI + 8);
  return "btCollisionShapeData";
}

Assistant:

const char*	btCollisionShape::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btCollisionShapeData* shapeData = (btCollisionShapeData*) dataBuffer;
	char* name = (char*) serializer->findNameForPointer(this);
	shapeData->m_name = (char*)serializer->getUniquePointer(name);
	if (shapeData->m_name)
	{
		serializer->serializeName(name);
	}
	shapeData->m_shapeType = m_shapeType;
	//shapeData->m_padding//??
	return "btCollisionShapeData";
}